

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestHugeFieldNumbersLite::Clear(TestHugeFieldNumbersLite *this)

{
  uint uVar1;
  ForeignMessageLite *this_00;
  TestHugeFieldNumbersLite_OptionalGroup *this_01;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeated_int32_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.packed_int32_);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::clear((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&(this->field_0)._impl_.string_string_map_);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_string_);
    }
    if ((uVar1 & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.optional_bytes_);
    }
    if ((uVar1 & 4) != 0) {
      this_00 = (this->field_0)._impl_.optional_message_;
      if (this_00 == (ForeignMessageLite *)0x0) {
        failure_msg = "_impl_.optional_message_ != nullptr";
        line = 0x29e7;
        goto LAB_001a62e3;
      }
      ForeignMessageLite::Clear(this_00);
    }
    if ((uVar1 & 8) != 0) {
      this_01 = (this->field_0)._impl_.optionalgroup_;
      if (this_01 == (TestHugeFieldNumbersLite_OptionalGroup *)0x0) {
        failure_msg = "_impl_.optionalgroup_ != nullptr";
        line = 0x29eb;
LAB_001a62e3:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestHugeFieldNumbersLite_OptionalGroup::Clear(this_01);
    }
  }
  if ((uVar1 & 0x70) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x88) = 0;
    (this->field_0)._impl_.optional_enum_ = 4;
  }
  clear_oneof_field(this);
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestHugeFieldNumbersLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestHugeFieldNumbersLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_int32_.Clear();
  _impl_.packed_int32_.Clear();
  _impl_.string_string_map_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.optional_string_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.optional_bytes_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.optional_message_ != nullptr);
      _impl_.optional_message_->Clear();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.optionalgroup_ != nullptr);
      _impl_.optionalgroup_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000070u) != 0) {
    ::memset(&_impl_.optional_int32_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.fixed_32_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_)) + sizeof(_impl_.fixed_32_));
    _impl_.optional_enum_ = 4;
  }
  clear_oneof_field();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}